

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_container_printf(bitset_container_t *v)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  int r;
  uint64_t t;
  uint64_t w;
  int i;
  _Bool iamfirst;
  uint32_t base;
  bitset_container_t *v_local;
  
  printf("{");
  i = 0;
  bVar3 = true;
  for (w._4_4_ = 0; w._4_4_ < 0x400; w._4_4_ = w._4_4_ + 1) {
    for (t = v->words[w._4_4_]; t != 0; t = t & (t ^ 0xffffffffffffffff) + 1 ^ t) {
      iVar1 = 0;
      for (uVar2 = t; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      if (bVar3) {
        printf("%u",(ulong)(uint)(i + iVar1));
        bVar3 = false;
      }
      else {
        printf(",%u",(ulong)(uint)(i + iVar1));
      }
    }
    i = i + 0x40;
  }
  printf("}");
  return;
}

Assistant:

void bitset_container_printf(const bitset_container_t * v) {
	printf("{");
	uint32_t base = 0;
	bool iamfirst = true;// TODO: rework so that this is not necessary yet still readable
	for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i) {
		uint64_t w = v->words[i];
		while (w != 0) {
			uint64_t t = w & (~w + 1);
			int r = __builtin_ctzll(w);
			if(iamfirst) {// predicted to be false
				printf("%u",base + r);
				iamfirst = false;
			} else {
				printf(",%u",base + r);
			}
			w ^= t;
		}
		base += 64;
	}
	printf("}");
}